

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int redisNetRead(redisContext *c,char *buf,size_t bufcap)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *str;
  
  sVar2 = recv(c->fd,buf,bufcap,0);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
    str = "Server closed the connection";
    iVar1 = 3;
  }
  else {
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 == 4) {
      return 0;
    }
    if (iVar1 == 0x6e) {
      if ((c->flags & 1) != 0) {
        str = "recv timeout";
        iVar1 = 6;
        goto LAB_00106c86;
      }
    }
    else if ((iVar1 == 0xb) && ((c->flags & 1) == 0)) {
      return 0;
    }
    iVar1 = 1;
    str = (char *)0x0;
  }
LAB_00106c86:
  __redisSetError(c,iVar1,str);
  return -1;
}

Assistant:

int redisNetRead(redisContext *c, char *buf, size_t bufcap) {
    int nread = recv(c->fd, buf, bufcap, 0);
    if (nread == -1) {
        if ((errno == EWOULDBLOCK && !(c->flags & REDIS_BLOCK)) || (errno == EINTR)) {
            /* Try again later */
            return 0;
        } else if(errno == ETIMEDOUT && (c->flags & REDIS_BLOCK)) {
            /* especially in windows */
            __redisSetError(c, REDIS_ERR_TIMEOUT, "recv timeout");
            return -1;
        } else {
            __redisSetError(c, REDIS_ERR_IO, NULL);
            return -1;
        }
    } else if (nread == 0) {
        __redisSetError(c, REDIS_ERR_EOF, "Server closed the connection");
        return -1;
    } else {
        return nread;
    }
}